

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::MakeUnique(Discreet3DSImporter *this,Mesh *sMesh)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  uint local_74;
  uint a;
  Face *face;
  uint base;
  uint i;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vNew2;
  allocator<aiVector3t<float>_> local_31;
  undefined1 local_30 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vNew;
  Mesh *sMesh_local;
  Discreet3DSImporter *this_local;
  
  vNew.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)sMesh;
  sVar2 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::size
                    (&(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
  std::allocator<aiVector3t<float>_>::allocator(&local_31);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30,sVar2 * 3,
             &local_31);
  std::allocator<aiVector3t<float>_>::~allocator(&local_31);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&base);
  sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &vNew.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[8].z);
  if (sVar2 != 0) {
    sVar2 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::size
                      ((vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_> *)
                       (vNew.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&base,sVar2 * 3);
  }
  face._4_4_ = 0;
  face._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::size
                      ((vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_> *)
                       (vNew.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    if (sVar2 <= face._4_4_) break;
    pvVar3 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::operator[]
                       ((vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_> *)
                        (vNew.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2),(ulong)face._4_4_);
    for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
      pvVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          vNew.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(pvVar3->super_FaceWithSmoothingGroup).mIndices[local_74]);
      pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30
                          ,(ulong)(uint)face);
      fVar1 = pvVar4->y;
      pvVar5->x = pvVar4->x;
      pvVar5->y = fVar1;
      pvVar5->z = pvVar4->z;
      sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &vNew.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[8].z);
      if (sVar2 != 0) {
        pvVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &vNew.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[8].z,
                            (ulong)(pvVar3->super_FaceWithSmoothingGroup).mIndices[local_74]);
        pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&base,
                            (ulong)(uint)face);
        fVar1 = pvVar4->y;
        pvVar5->x = pvVar4->x;
        pvVar5->y = fVar1;
        pvVar5->z = pvVar4->z;
      }
      (pvVar3->super_FaceWithSmoothingGroup).mIndices[local_74] = (uint)face;
      face._0_4_ = (uint)face + 1;
    }
    face._4_4_ = face._4_4_ + 1;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             vNew.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,
             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &vNew.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[8].z,
             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&base);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&base);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  return;
}

Assistant:

void Discreet3DSImporter::MakeUnique(D3DS::Mesh& sMesh)
{
    // TODO: really necessary? I don't think. Just a waste of memory and time
    // to do it now in a separate buffer.

    // Allocate output storage
    std::vector<aiVector3D> vNew  (sMesh.mFaces.size() * 3);
    std::vector<aiVector3D> vNew2;
    if (sMesh.mTexCoords.size())
        vNew2.resize(sMesh.mFaces.size() * 3);

    for (unsigned int i = 0, base = 0; i < sMesh.mFaces.size();++i)
    {
        D3DS::Face& face = sMesh.mFaces[i];

        // Positions
        for (unsigned int a = 0; a < 3;++a,++base)
        {
            vNew[base] = sMesh.mPositions[face.mIndices[a]];
            if (sMesh.mTexCoords.size())
                vNew2[base] = sMesh.mTexCoords[face.mIndices[a]];

            face.mIndices[a] = base;
        }
    }
    sMesh.mPositions = vNew;
    sMesh.mTexCoords = vNew2;
}